

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O0

void __thiscall CTcSrcFile::CTcSrcFile(CTcSrcFile *this,osfildef *fp,CCharmapToUni *mapper)

{
  CVmFileSource *this_00;
  undefined8 in_RDX;
  osfildef *in_RDI;
  
  CTcSrcObject::CTcSrcObject((CTcSrcObject *)in_RDI);
  *(undefined ***)in_RDI = &PTR__CTcSrcFile_003d6d48;
  this_00 = (CVmFileSource *)operator_new(0x10);
  CVmFileSource::CVmFileSource(this_00,in_RDI);
  in_RDI->_IO_read_end = (char *)this_00;
  *(byte *)&in_RDI->_IO_read_ptr = *(byte *)&in_RDI->_IO_read_ptr & 0xfe;
  in_RDI[4].__pad5 = 0;
  *(undefined8 *)(in_RDI[4]._unused2 + 4) = in_RDX;
  return;
}

Assistant:

CTcSrcFile::CTcSrcFile(osfildef *fp, class CCharmapToUni *mapper)
{
    /* remember my source file */
    fp_ = new CVmFileSource(fp);

    /* net yet at end of file */
    at_eof_ = FALSE;
    
    /* there's no data in the buffer yet */
    rem_ = 0;
    
    /* remember my character mapper */
    mapper_ = mapper;
}